

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_mp3_get_cursor_in_pcm_frames(ma_mp3 *pMP3,ma_uint64 *pCursor)

{
  ma_uint64 *pCursor_local;
  ma_mp3 *pMP3_local;
  ma_result local_4;
  
  if (pCursor == (ma_uint64 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *pCursor = 0;
    if (pMP3 == (ma_mp3 *)0x0) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      *pCursor = (pMP3->dr).currentPCMFrame;
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_mp3_get_cursor_in_pcm_frames(ma_mp3* pMP3, ma_uint64* pCursor)
{
    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;   /* Safety. */

    if (pMP3 == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_MP3)
    {
        *pCursor = pMP3->dr.currentPCMFrame;

        return MA_SUCCESS;
    }
    #else
    {
        /* mp3 is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}